

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIncludeDirectoryCommand.cxx
# Opt level: O2

void NormalizeInclude(cmMakefile *mf,string *inc)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  string *a;
  string_view value;
  char local_41;
  string local_40;
  
  uVar2 = std::__cxx11::string::find_first_not_of((char *)inc,0x6b0672);
  lVar3 = std::__cxx11::string::find_last_not_of((char *)inc,0x6b0672);
  if (lVar3 == -1 || uVar2 == 0xffffffffffffffff) {
    inc->_M_string_length = 0;
    *(inc->_M_dataplus)._M_p = '\0';
  }
  else {
    std::__cxx11::string::assign((string *)inc,(ulong)inc,uVar2);
    value._M_str = (inc->_M_dataplus)._M_p;
    value._M_len = inc->_M_string_length;
    bVar1 = cmValue::IsOff(value);
    if (!bVar1) {
      cmsys::SystemTools::ConvertToUnixSlashes(inc);
      bVar1 = cmsys::SystemTools::FileIsFullPath(inc);
      if (!bVar1) {
        bVar1 = cmGeneratorExpression::StartsWithGeneratorExpression(inc);
        if (!bVar1) {
          a = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(mf);
          local_41 = '/';
          cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string&>
                    (&local_40,a,&local_41,inc);
          std::__cxx11::string::operator=((string *)inc,(string *)&local_40);
          std::__cxx11::string::~string((string *)&local_40);
        }
      }
    }
  }
  return;
}

Assistant:

static void NormalizeInclude(cmMakefile& mf, std::string& inc)
{
  std::string::size_type b = inc.find_first_not_of(" \r");
  std::string::size_type e = inc.find_last_not_of(" \r");
  if ((b != std::string::npos) && (e != std::string::npos)) {
    inc.assign(inc, b, 1 + e - b); // copy the remaining substring
  } else {
    inc.clear();
    return;
  }

  if (!cmIsOff(inc)) {
    cmSystemTools::ConvertToUnixSlashes(inc);
    if (!cmSystemTools::FileIsFullPath(inc) &&
        !cmGeneratorExpression::StartsWithGeneratorExpression(inc)) {
      inc = cmStrCat(mf.GetCurrentSourceDirectory(), '/', inc);
    }
  }
}